

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void RenderLoop(void)

{
  double dVar1;
  GLenum GVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  uint *puVar6;
  GLuint zero;
  GLfloat currentFrame;
  Shader postProcessingShader;
  Shader transparentShader;
  Shader opaqueShader;
  Model glTF_model;
  mat4 projection;
  mat4 pre_view;
  mat4 view;
  vector<unsigned_int,_std::allocator<unsigned_int>_> headPtrClear;
  GLuint headPtrTex;
  GLuint buffers [2];
  GLint SIZE_NODE;
  GLuint NUM_NODES;
  int LINKED_LIST_BUFFER;
  int COUNTER_BUFFER;
  GLuint multisampleDepth;
  GLuint multisampleTex;
  GLuint multisampledFBO;
  GLenum err;
  float in_stack_fffffffffffff868;
  float in_stack_fffffffffffff86c;
  float in_stack_fffffffffffff870;
  float in_stack_fffffffffffff874;
  allocator_type *in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff880;
  int in_stack_fffffffffffff884;
  string *in_stack_fffffffffffff888;
  Shader *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff898;
  int in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  PFNGLTEXSUBIMAGE2DPROC in_stack_fffffffffffff8a8;
  Model *in_stack_fffffffffffff8b0;
  string *in_stack_fffffffffffff8d8;
  Model *in_stack_fffffffffffff8e0;
  GLsizei GVar7;
  int *this;
  undefined1 local_649 [40];
  undefined1 local_621 [40];
  allocator<char> local_5f9;
  string local_5f8 [32];
  undefined4 local_5d8;
  undefined1 local_5d1 [40];
  allocator<char> local_5a9;
  string local_5a8 [39];
  allocator<char> local_581;
  string local_580 [96];
  float local_520;
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [39];
  allocator<char> local_4c9;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [111];
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [111];
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [684];
  undefined4 local_4c;
  GLuint local_2c;
  GLuint local_28;
  GLuint local_24;
  int local_20;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  GLuint local_10;
  GLuint local_c;
  GLuint local_8;
  GLenum local_4;
  
  (*glad_glGenFramebuffers)(1,&local_8);
  (*glad_glBindFramebuffer)(0x8d40,local_8);
  (*glad_glGenTextures)(1,&local_c);
  (*glad_glBindTexture)(0x9100,local_c);
  (*glad_glTexImage2DMultisample)
            (0x9100,4,0x8814,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,'\x01');
  (*glad_glBindTexture)(0x9100,0);
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0x9100,local_c,0);
  (*glad_glGenRenderbuffers)(1,&local_10);
  (*glad_glBindRenderbuffer)(0x8d41,local_10);
  (*glad_glRenderbufferStorageMultisample)
            (0x8d41,4,0x88f0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT);
  (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,local_10);
  GVar2 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar2 != 0x8cd5) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Framebuffer not complete!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  local_14 = 0;
  local_18 = 1;
  this = &WindowConfig::SCR_WIDTH;
  local_1c = WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT * 0x10;
  local_20 = 0x18;
  (*glad_glGenBuffers)(2,&local_28);
  (*glad_glBindBuffer)(0x92c0,local_28);
  (*glad_glBufferData)(0x92c0,4,(void *)0x0,0x88e8);
  (*glad_glBindBuffer)(0x90d2,local_24);
  (*glad_glBufferData)(0x90d2,(ulong)(uint)(local_1c * local_20),(void *)0x0,0x88e8);
  GVar7 = 1;
  (*glad_glGenTextures)(1,&local_2c);
  GVar2 = 0xde1;
  (*glad_glBindTexture)(0xde1,local_2c);
  (*glad_glTexStorage2D)
            (GVar2,GVar7,0x8236,
             *(GLsizei *)
              &(((Model *)this)->transparent_queue).c.
               super__Vector_base<std::pair<float,_Model::RenderDependence>,_std::allocator<std::pair<float,_Model::RenderDependence>_>_>
               ._M_impl.super__Vector_impl_data._M_start,WindowConfig::SCR_HEIGHT);
  local_4c = 0xffffffff;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10fe82);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff890,
             (size_type)in_stack_fffffffffffff888,
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
             in_stack_fffffffffffff878);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10feb6);
  glm::perspective<float>
            (in_stack_fffffffffffff874,in_stack_fffffffffffff870,in_stack_fffffffffffff86c,
             in_stack_fffffffffffff868);
  Model::Model(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::Shader((Shader *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898,(string *)in_stack_fffffffffffff890);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  Shader::Use((Shader *)0x10ffda);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::setMat4(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                  (mat4 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::Shader((Shader *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898,(string *)in_stack_fffffffffffff890);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  Shader::Use((Shader *)0x11010e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::setInt(in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff884);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::setMat4(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                  (mat4 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::Shader((Shader *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898,(string *)in_stack_fffffffffffff890);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  Shader::Use((Shader *)0x1102ad);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::setInt(in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff884);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  Shader::setInt(in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff884);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  while( true ) {
    local_4 = (*glad_glGetError)();
    if (local_4 == 0) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"Before Start");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::showbase);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,local_4);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  local_4 = 0;
  while( true ) {
    iVar3 = glfwWindowShouldClose
                      ((GLFWwindow *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
    if (iVar3 != 0) break;
    dVar1 = glfwGetTime();
    local_520 = (float)dVar1;
    RenderLoop::deltaTime = local_520 - RenderLoop::lastFrame;
    RenderLoop::lastFrame = local_520;
    glfwPollEvents();
    Controller::Movement(5.51475085756708e-318);
    local_2f8[0x240] = local_2f8[0x280];
    local_2f8[0x241] = local_2f8[0x281];
    local_2f8[0x242] = local_2f8[0x282];
    local_2f8[0x243] = local_2f8[0x283];
    local_2f8[0x244] = local_2f8[0x284];
    local_2f8[0x245] = local_2f8[0x285];
    local_2f8[0x246] = local_2f8[0x286];
    local_2f8[0x247] = local_2f8[0x287];
    local_2f8[0x248] = local_2f8[0x288];
    local_2f8[0x249] = local_2f8[0x289];
    local_2f8[0x24a] = local_2f8[0x28a];
    local_2f8[0x24b] = local_2f8[0x28b];
    local_2f8[0x24c] = local_2f8[0x28c];
    local_2f8[0x24d] = local_2f8[0x28d];
    local_2f8[0x24e] = local_2f8[0x28e];
    local_2f8[0x24f] = local_2f8[0x28f];
    local_2f8[0x230] = local_2f8[0x270];
    local_2f8[0x231] = local_2f8[0x271];
    local_2f8[0x232] = local_2f8[0x272];
    local_2f8[0x233] = local_2f8[0x273];
    local_2f8[0x234] = local_2f8[0x274];
    local_2f8[0x235] = local_2f8[0x275];
    local_2f8[0x236] = local_2f8[0x276];
    local_2f8[0x237] = local_2f8[0x277];
    local_2f8[0x238] = local_2f8[0x278];
    local_2f8[0x239] = local_2f8[0x279];
    local_2f8[0x23a] = local_2f8[0x27a];
    local_2f8[0x23b] = local_2f8[0x27b];
    local_2f8[0x23c] = local_2f8[0x27c];
    local_2f8[0x23d] = local_2f8[0x27d];
    local_2f8[0x23e] = local_2f8[0x27e];
    local_2f8[0x23f] = local_2f8[0x27f];
    local_2f8[0x220] = local_2f8[0x260];
    local_2f8[0x221] = local_2f8[0x261];
    local_2f8[0x222] = local_2f8[0x262];
    local_2f8[0x223] = local_2f8[0x263];
    local_2f8[0x224] = local_2f8[0x264];
    local_2f8[0x225] = local_2f8[0x265];
    local_2f8[0x226] = local_2f8[0x266];
    local_2f8[0x227] = local_2f8[0x267];
    local_2f8[0x228] = local_2f8[0x268];
    local_2f8[0x229] = local_2f8[0x269];
    local_2f8[0x22a] = local_2f8[0x26a];
    local_2f8[0x22b] = local_2f8[0x26b];
    local_2f8[0x22c] = local_2f8[0x26c];
    local_2f8[0x22d] = local_2f8[0x26d];
    local_2f8[0x22e] = local_2f8[0x26e];
    local_2f8[0x22f] = local_2f8[0x26f];
    local_2f8[0x210] = local_2f8[0x250];
    local_2f8[0x211] = local_2f8[0x251];
    local_2f8[0x212] = local_2f8[0x252];
    local_2f8[0x213] = local_2f8[0x253];
    local_2f8[0x214] = local_2f8[0x254];
    local_2f8[0x215] = local_2f8[0x255];
    local_2f8[0x216] = local_2f8[0x256];
    local_2f8[0x217] = local_2f8[599];
    local_2f8[0x218] = local_2f8[600];
    local_2f8[0x219] = local_2f8[0x259];
    local_2f8[0x21a] = local_2f8[0x25a];
    local_2f8[0x21b] = local_2f8[0x25b];
    local_2f8[0x21c] = local_2f8[0x25c];
    local_2f8[0x21d] = local_2f8[0x25d];
    local_2f8[0x21e] = local_2f8[0x25e];
    local_2f8[0x21f] = local_2f8[0x25f];
    Camera::GetViewMatrix((Camera *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    local_2f8[0x280] = local_580[0x50];
    local_2f8[0x281] = local_580[0x51];
    local_2f8[0x282] = local_580[0x52];
    local_2f8[0x283] = local_580[0x53];
    local_2f8[0x284] = local_580[0x54];
    local_2f8[0x285] = local_580[0x55];
    local_2f8[0x286] = local_580[0x56];
    local_2f8[0x287] = local_580[0x57];
    local_2f8[0x288] = local_580[0x58];
    local_2f8[0x289] = local_580[0x59];
    local_2f8[0x28a] = local_580[0x5a];
    local_2f8[0x28b] = local_580[0x5b];
    local_2f8[0x28c] = local_580[0x5c];
    local_2f8[0x28d] = local_580[0x5d];
    local_2f8[0x28e] = local_580[0x5e];
    local_2f8[0x28f] = local_580[0x5f];
    local_2f8[0x270] = local_580[0x40];
    local_2f8[0x271] = local_580[0x41];
    local_2f8[0x272] = local_580[0x42];
    local_2f8[0x273] = local_580[0x43];
    local_2f8[0x274] = local_580[0x44];
    local_2f8[0x275] = local_580[0x45];
    local_2f8[0x276] = local_580[0x46];
    local_2f8[0x277] = local_580[0x47];
    local_2f8[0x278] = local_580[0x48];
    local_2f8[0x279] = local_580[0x49];
    local_2f8[0x27a] = local_580[0x4a];
    local_2f8[0x27b] = local_580[0x4b];
    local_2f8[0x27c] = local_580[0x4c];
    local_2f8[0x27d] = local_580[0x4d];
    local_2f8[0x27e] = local_580[0x4e];
    local_2f8[0x27f] = local_580[0x4f];
    local_2f8[0x260] = local_580[0x30];
    local_2f8[0x261] = local_580[0x31];
    local_2f8[0x262] = local_580[0x32];
    local_2f8[0x263] = local_580[0x33];
    local_2f8[0x264] = local_580[0x34];
    local_2f8[0x265] = local_580[0x35];
    local_2f8[0x266] = local_580[0x36];
    local_2f8[0x267] = local_580[0x37];
    local_2f8[0x268] = local_580[0x38];
    local_2f8[0x269] = local_580[0x39];
    local_2f8[0x26a] = local_580[0x3a];
    local_2f8[0x26b] = local_580[0x3b];
    local_2f8[0x26c] = local_580[0x3c];
    local_2f8[0x26d] = local_580[0x3d];
    local_2f8[0x26e] = local_580[0x3e];
    local_2f8[0x26f] = local_580[0x3f];
    local_2f8[0x250] = local_580[0x20];
    local_2f8[0x251] = local_580[0x21];
    local_2f8[0x252] = local_580[0x22];
    local_2f8[0x253] = local_580[0x23];
    local_2f8[0x254] = local_580[0x24];
    local_2f8[0x255] = local_580[0x25];
    local_2f8[0x256] = local_580[0x26];
    local_2f8[599] = local_580[0x27];
    local_2f8[600] = local_580[0x28];
    local_2f8[0x259] = local_580[0x29];
    local_2f8[0x25a] = local_580[0x2a];
    local_2f8[0x25b] = local_580[0x2b];
    local_2f8[0x25c] = local_580[0x2c];
    local_2f8[0x25d] = local_580[0x2d];
    local_2f8[0x25e] = local_580[0x2e];
    local_2f8[0x25f] = local_580[0x2f];
    (*glad_glBindFramebuffer)(0x8d40,local_8);
    (*glad_glClear)(0x4100);
    Shader::Use((Shader *)0x1108fb);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    Shader::setMat4(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                    (mat4 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator(&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    Shader::setMat4(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                    (mat4 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    std::__cxx11::string::~string(local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    in_stack_fffffffffffff8b0 = (Model *)local_5d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    Shader::setVec3(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                    (vec3 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    std::__cxx11::string::~string((string *)(local_5d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5d1);
    Model::Update((Model *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                  (double)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
    Model::Render((Model *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                  (Shader *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
    (*glad_glBindFramebuffer)(0x8d40,0);
    (*glad_glBindTexture)(0xde1,local_2c);
    in_stack_fffffffffffff8a0 = WindowConfig::SCR_WIDTH;
    in_stack_fffffffffffff8a4 = WindowConfig::SCR_HEIGHT;
    in_stack_fffffffffffff8a8 = glad_glTexSubImage2D;
    puVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x110ac9);
    (*in_stack_fffffffffffff8a8)
              (0xde1,0,0,0,in_stack_fffffffffffff8a0,in_stack_fffffffffffff8a4,0x8d94,0x1405,puVar6)
    ;
    local_5d8 = 0;
    (*glad_glBindBuffer)(0x92c0,local_28);
    (*glad_glBufferSubData)(0x92c0,0,4,&local_5d8);
    (*glad_glBindFramebuffer)(0x8ca8,local_8);
    (*glad_glBindFramebuffer)(0x8ca9,0);
    in_stack_fffffffffffff880 = 0x2600;
    in_stack_fffffffffffff870 = (float)WindowConfig::SCR_HEIGHT;
    (*glad_glBlitFramebuffer)
              (0,0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,0,0,WindowConfig::SCR_WIDTH,
               WindowConfig::SCR_HEIGHT,0x100,0x2600);
    (*glad_glBindFramebuffer)(0x8ca8,0);
    (*glad_glBindFramebuffer)(0x8ca9,0);
    (*glad_glClear)(0x4000);
    (*glad_glDepthMask)('\0');
    Shader::Use((Shader *)0x110c12);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    Shader::setMat4(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                    (mat4 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    in_stack_fffffffffffff890 = (Shader *)local_621;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    Shader::setMat4(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                    (mat4 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    std::__cxx11::string::~string((string *)(local_621 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_621);
    in_stack_fffffffffffff888 = (string *)local_649;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    Shader::setVec3(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                    (vec3 *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    std::__cxx11::string::~string((string *)(local_649 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_649);
    (*glad_glBindBufferBase)(0x92c0,0,local_28);
    (*glad_glBindBufferBase)(0x90d2,0,local_24);
    (*glad_glBindImageTexture)(0,local_2c,0,'\0',0,0x88ba,0x8236);
    Model::RenderTransparent((Model *)this,(Shader *)CONCAT44(GVar7,GVar2));
    (*glad_glDepthMask)('\x01');
    (*glad_glClear)(0x100);
    Shader::Use((Shader *)0x110dfa);
    (*glad_glBindBufferBase)(0x90d2,0,local_24);
    in_stack_fffffffffffff868 = 4.67109e-41;
    (*glad_glBindImageTexture)(0,local_2c,0,'\0',0,0x88ba,0x8236);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glBindTexture)(0x9100,local_c);
    RenderQuad();
    glfwSwapBuffers((GLFWwindow *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  }
  Model::CleanupModel(in_stack_fffffffffffff8b0);
  Shader::Release((Shader *)0x111064);
  Shader::Release((Shader *)0x111073);
  (*glad_glDeleteTextures)(1,&local_c);
  (*glad_glDeleteTextures)(1,&local_10);
  (*glad_glDeleteFramebuffers)(1,&local_8);
  (*glad_glDeleteBuffers)(2,&local_28);
  (*glad_glDeleteTextures)(1,&local_2c);
  Shader::~Shader((Shader *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  Shader::~Shader((Shader *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  Shader::~Shader((Shader *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  Model::~Model((Model *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  return;
}

Assistant:

void RenderLoop()
{
    GLenum err;
    GLuint multisampledFBO;
    glGenFramebuffers(1, &multisampledFBO);
    glBindFramebuffer(GL_FRAMEBUFFER, multisampledFBO);
    GLuint multisampleTex;
    glGenTextures(1, &multisampleTex);
    glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, multisampleTex);
    glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA32F, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, GL_TRUE);
    glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, multisampleTex, 0);
    GLuint multisampleDepth;
    glGenRenderbuffers(1, &multisampleDepth);
    glBindRenderbuffer(GL_RENDERBUFFER, multisampleDepth);
    glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_DEPTH24_STENCIL8, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT);
    glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, multisampleDepth);
    // - Finally check if framebuffer is complete
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
    {
        std::cout << "Framebuffer not complete!" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    // OIT buffers
    const int COUNTER_BUFFER = 0;
    const int LINKED_LIST_BUFFER = 1;
    GLuint NUM_NODES = 16 * WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT;
    GLint SIZE_NODE = 5 * sizeof(GLfloat) + sizeof(GLuint); // The size of a linked list node
    // Our atomic counter
    GLuint buffers[2];
    glGenBuffers(2, buffers);
    glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffers[COUNTER_BUFFER]);
    glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
    // The buffer of linked lists
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[LINKED_LIST_BUFFER]);
    glBufferData(GL_SHADER_STORAGE_BUFFER, NUM_NODES * SIZE_NODE, NULL, GL_DYNAMIC_DRAW);

    // The buffer for the head pointers, as an image texture
    GLuint headPtrTex;
    glGenTextures(1, &headPtrTex);
    glBindTexture(GL_TEXTURE_2D, headPtrTex);
    glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT);

    vector<GLuint> headPtrClear(WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT, 0xffffffff);
    // GLuint clearBuf;
    // glGenBuffers(1, &clearBuf);
    // glBindBuffer(GL_PIXEL_UNPACK_BUFFER, clearBuf);
    // glBufferData(GL_PIXEL_UNPACK_BUFFER, headPtrClear.size() * sizeof(GLuint), &headPtrClear[0], GL_STREAM_DRAW);

    mat4 view, pre_view;
    mat4 projection = glm::perspective(WindowConfig::mainCamera->Zoom,
                                       (float)WindowConfig::SCR_WIDTH / (float)WindowConfig::SCR_HEIGHT,
                                       NEAR, FAR);
    Model glTF_model(glTF_model_path);
    Shader opaqueShader("../shaders/skin/opaque.vert", "../shaders/skin/opaque.frag");
    opaqueShader.Use();
    opaqueShader.setMat4("projection", projection);

    Shader transparentShader("../shaders/skin/transparent.vert", "../shaders/skin/transparent.frag");
    transparentShader.Use();
    transparentShader.setInt("MAX_NODES", NUM_NODES);
    transparentShader.setMat4("projection", projection);

    Shader postProcessingShader("../shaders/skin/postprocessing.vert", "../shaders/skin/postprocessing.frag");
    postProcessingShader.Use();
    postProcessingShader.setInt("MAX_NODES", NUM_NODES);
    postProcessingShader.setInt("colorTextureMS", 0);

    while ((err = glGetError()) != GL_NO_ERROR)
    {
        cout << "Before Start" << hex << showbase << err << endl;
    }
    static float deltaTime(0.0f); //        float attenuation = 1.0 / (distance * distance);
    static float lastFrame(0.0f);
    while (!glfwWindowShouldClose(WindowConfig::window))
    {
        GLfloat currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        // Movement System
        glfwPollEvents();
        Controller::Movement(deltaTime);
        pre_view = view;
        view = WindowConfig::mainCamera->GetViewMatrix();
        // Render model
        glBindFramebuffer(GL_FRAMEBUFFER, multisampledFBO);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        opaqueShader.Use();
        opaqueShader.setMat4("view", view);
        opaqueShader.setMat4("pre_view", pre_view);
        opaqueShader.setVec3("CameraPos", WindowConfig::mainCamera->Position);
        glTF_model.Update(currentFrame);
        glTF_model.Render(opaqueShader);
        // glTF_model.RenderTransparent(opaqueShader);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);
        // // Clear OIT buffers
        // glBindBuffer(GL_PIXEL_UNPACK_BUFFER, clearBuf);
        glBindTexture(GL_TEXTURE_2D, headPtrTex);
        glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, GL_RED_INTEGER, GL_UNSIGNED_INT, headPtrClear.data());
        GLuint zero = 0;
        glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffers[COUNTER_BUFFER]);
        glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &zero);
        // Blit
        glBindFramebuffer(GL_READ_FRAMEBUFFER, multisampledFBO);
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
        glBlitFramebuffer(0, 0, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, 
                          0, 0, WindowConfig::SCR_WIDTH,  WindowConfig::SCR_HEIGHT, GL_DEPTH_BUFFER_BIT, GL_NEAREST);
        glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
        // Render Transparent
        glClear(GL_COLOR_BUFFER_BIT);
        glDepthMask(GL_FALSE);
        transparentShader.Use();
        transparentShader.setMat4("view", view);
        transparentShader.setMat4("pre_view", pre_view);
        transparentShader.setVec3("CameraPos", WindowConfig::mainCamera->Position);
        glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, buffers[COUNTER_BUFFER]);
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffers[LINKED_LIST_BUFFER]);
        glBindImageTexture(0, headPtrTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
        glTF_model.RenderTransparent(transparentShader);
        glDepthMask(GL_TRUE);
        // Render screen
        glClear(GL_DEPTH_BUFFER_BIT);
        postProcessingShader.Use();
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffers[LINKED_LIST_BUFFER]);
        glBindImageTexture(0, headPtrTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, multisampleTex);
        RenderQuad();

        // Swap the screen buffers, Check and call events
        glfwSwapBuffers(WindowConfig::window);
    }
    // Release
    glTF_model.CleanupModel();
    opaqueShader.Release();
    postProcessingShader.Release();
    glDeleteTextures(1, &multisampleTex);
    glDeleteTextures(1, &multisampleDepth);
    glDeleteFramebuffers(1, &multisampledFBO);
    glDeleteBuffers(2, buffers);
    glDeleteTextures(1, &headPtrTex);
}